

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O3

void oonf_class_remove(oonf_class *ci)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  
  avl_remove(&_classes_tree,&ci->_node);
  _free_freelist(ci);
  plVar4 = (ci->_extensions).next;
  plVar2 = (ci->_extensions).prev;
  plVar3 = plVar4->prev;
  if (plVar3 != plVar2) {
    do {
      plVar1 = plVar4->next;
      if (plVar3 != (list_entity *)0x0 && plVar1 != (list_entity *)0x0) {
        plVar3->next = plVar1;
        plVar1->prev = plVar3;
        plVar4[-2].next = (list_entity *)0x0;
        plVar4->next = (list_entity *)0x0;
        plVar4->prev = (list_entity *)0x0;
        plVar2 = (ci->_extensions).prev;
      }
      plVar3 = plVar1->prev;
      plVar4 = plVar1;
    } while (plVar3 != plVar2);
  }
  if ((log_global_mask[_oonf_class_subsystem.logging] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x99,
             (void *)0x0,0,"Class %s removed\n",ci->name);
  }
  return;
}

Assistant:

void
oonf_class_remove(struct oonf_class *ci) {
  struct oonf_class_extension *ext, *iterator;

  /* remove memcookie from tree */
  avl_remove(&_classes_tree, &ci->_node);

  /* remove all free memory blocks */
  _free_freelist(ci);

  /* remove all listeners */
  list_for_each_element_safe(&ci->_extensions, ext, _node, iterator) {
    oonf_class_extension_remove(ext);
  }

  OONF_DEBUG(LOG_CLASS, "Class %s removed\n", ci->name);
}